

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int strarray_prepend(strarray *array,char *string)

{
  size_t sVar1;
  size_t sVar2;
  char *__src;
  char *ptr;
  size_t new_length;
  size_t length;
  char *string_local;
  strarray *array_local;
  
  sVar1 = strlen(string);
  sVar1 = sVar1 + 1;
  sVar2 = array->length + sVar1;
  __src = (char *)realloc(array->value,sVar2 + 0x3f & 0xffffffffffffffc0);
  if (__src == (char *)0x0) {
    array_local._4_4_ = -1;
  }
  else {
    memmove(__src + sVar1,__src,array->length);
    memcpy(__src,string,sVar1);
    array->value = __src;
    array->length = sVar2;
    array_local._4_4_ = 0;
  }
  return array_local._4_4_;
}

Assistant:

int
strarray_prepend(struct strarray *array, const char *string) {
  size_t length, new_length;
  char *ptr;

  length = strlen(string) + 1;

  new_length = array->length + length;
  ptr = realloc(array->value, STRARRAY_MEMSIZE(new_length));
  if (ptr == NULL) {
    return -1;
  }

  memmove(ptr + length, ptr, array->length);
  memcpy(ptr, string, length);
  array->value = ptr;
  array->length = new_length;
  return 0;
}